

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileBacktrace::Entry::~Entry(Entry *this)

{
  bool bVar1;
  Entry *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->Parent);
  if (bVar1) {
    cmListFileContext::~cmListFileContext((cmListFileContext *)this);
  }
  std::shared_ptr<const_cmListFileBacktrace::Entry>::~shared_ptr(&this->Parent);
  return;
}

Assistant:

~Entry()
  {
    if (this->Parent) {
      this->Context.~cmListFileContext();
    } else {
      this->Bottom.~cmStateSnapshot();
    }
  }